

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  bool bVar1;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  LogMessage local_40;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  ArrayInputStream *pAStack_18;
  int count_local;
  ArrayInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pAStack_18 = this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(count);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"count >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x50,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  this->last_returned_size_ = 0;
  bVar1 = absl_log_internal_check_op_result._4_4_ <= this->size_ - this->position_;
  if (bVar1) {
    this->position_ = absl_log_internal_check_op_result._4_4_ + this->position_;
  }
  else {
    this->position_ = this->size_;
  }
  return bVar1;
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  ABSL_CHECK_GE(count, 0);
  last_returned_size_ = 0;  // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}